

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

target_ulong_conflict
helper_tsubcctv_sparc(CPUSPARCState *env,target_ulong_conflict src1,target_ulong_conflict src2)

{
  uint uVar1;
  uintptr_t unaff_retaddr;
  
  if ((((src2 | src1) & 3) == 0) &&
     (uVar1 = src1 - src2, -1 < (int)((uVar1 ^ src1) & (src2 ^ src1)))) {
    env->cc_op = 10;
    env->cc_src = src1;
    env->cc_src2 = src2;
    env->cc_dst = uVar1;
    return uVar1;
  }
  cpu_raise_exception_ra_sparc(env,10,unaff_retaddr);
}

Assistant:

target_ulong helper_tsubcctv(CPUSPARCState *env, target_ulong src1,
                             target_ulong src2)
{
    target_ulong dst;

    /* Tag overflow occurs if either input has bits 0 or 1 set.  */
    if ((src1 | src2) & 3) {
        goto tag_overflow;
    }

    dst = src1 - src2;

    /* Tag overflow occurs if the subtraction overflows.  */
    if ((src1 ^ src2) & (src1 ^ dst) & (1u << 31)) {
        goto tag_overflow;
    }

    /* Only modify the CC after any exceptions have been generated.  */
    env->cc_op = CC_OP_TSUBTV;
    env->cc_src = src1;
    env->cc_src2 = src2;
    env->cc_dst = dst;
    return dst;

 tag_overflow:
    cpu_raise_exception_ra(env, TT_TOVF, GETPC());
}